

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14174cb::SADSkipx4Test_SrcAlignedByWidth_Test::TestBody
          (SADSkipx4Test_SrcAlignedByWidth_Test *this)

{
  uint8_t *in_RDI;
  uint8_t *tmp_source_data;
  SADSkipx4Test *in_stack_00000040;
  undefined8 in_stack_ffffffffffffffe0;
  int iVar1;
  SADTestBase *pSVar2;
  
  pSVar2 = (anonymous_namespace)::SADTestBase::source_data_;
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  (anonymous_namespace)::SADTestBase::source_data_ =
       (SADTestBase *)
       ((long)&((anonymous_namespace)::SADTestBase::source_data_->super_Test)._vptr_Test +
       (long)*(int *)(in_RDI + 0x18));
  SADTestBase::FillRandom(pSVar2,in_RDI,iVar1);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,0);
  SADTestBase::FillRandom(pSVar2,in_RDI,iVar1);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,1);
  SADTestBase::FillRandom(pSVar2,in_RDI,iVar1);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,2);
  SADTestBase::FillRandom(pSVar2,in_RDI,iVar1);
  iVar1 = (int)((ulong)(in_RDI + 8) >> 0x20);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,3);
  SADTestBase::FillRandom(pSVar2,in_RDI,iVar1);
  SADSkipx4Test::CheckSADs(in_stack_00000040);
  (anonymous_namespace)::SADTestBase::source_data_ = pSVar2;
  return;
}

Assistant:

TEST_P(SADSkipx4Test, SrcAlignedByWidth) {
  uint8_t *tmp_source_data = source_data_;
  source_data_ += width_;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  source_data_ = tmp_source_data;
}